

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

void __thiscall
GlobOpt::KillLiveFields
          (GlobOpt *this,BVSparse<Memory::JitArenaAllocator> *fieldsToKill,
          BVSparse<Memory::JitArenaAllocator> *bv)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Loop *pLVar4;
  
  if (bv == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0xc2,"(bv)","bv");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (fieldsToKill != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>(bv,fieldsToKill);
    pLVar4 = this->rootLoopPrePass;
    if (pLVar4 != (Loop *)0x0 && this->prePassLoop != (Loop *)0x0) {
      do {
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                  (pLVar4->fieldKilled,fieldsToKill);
        pLVar4 = pLVar4->parent;
      } while (pLVar4 != (Loop *)0x0);
    }
  }
  return;
}

Assistant:

void GlobOpt::KillLiveFields(BVSparse<JitArenaAllocator> *const fieldsToKill, BVSparse<JitArenaAllocator> *const bv) const
{
    Assert(bv);

    if (fieldsToKill)
    {
        bv->Minus(fieldsToKill);

        if (this->IsLoopPrePass())
        {
            for (Loop * loop = this->rootLoopPrePass; loop != nullptr; loop = loop->parent)
            {
                loop->fieldKilled->Or(fieldsToKill);
            }
        }
    }
}